

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1a45235::WriterSpy::~WriterSpy(WriterSpy *this,void **vtt)

{
  void **vtt_local;
  WriterSpy *this_local;
  
  this->super_Writer = (Writer)*vtt;
  *(void **)(&(this->super_Writer).field_0x0 + *(long *)((long)this->super_Writer + -0x30)) = vtt[3]
  ;
  std::__cxx11::string::~string((string *)&this->prefix);
  std::shared_ptr<dap::Writer>::~shared_ptr(&this->s);
  std::shared_ptr<dap::Writer>::~shared_ptr(&this->w);
  dap::Writer::~Writer(&this->super_Writer,vtt + 1);
  return;
}

Assistant:

WriterSpy(const std::shared_ptr<dap::Writer>& w,
            const std::shared_ptr<dap::Writer>& s,
            const std::string& prefix)
      : w(w), s(s), prefix(prefix) {}